

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

Select * __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::FinalOptimizer::selectify(wasm::If__
          (void *this,If *iff)

{
  bool bVar1;
  Select *pSVar2;
  undefined1 local_448 [8];
  EffectAnalyzer ifTrue;
  EffectAnalyzer ifFalse;
  EffectAnalyzer condition;
  
  if ((((iff->ifFalse != (Expression *)0x0) &&
       (bVar1 = Properties::canEmitSelectWithArms(iff->ifTrue,iff->ifFalse), bVar1)) &&
      ((iff->condition->type).id != 1)) &&
     (bVar1 = tooCostlyToRunUnconditionally
                        (*(PassOptions **)((long)this + 0xe0),iff->ifTrue,iff->ifFalse), !bVar1)) {
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)local_448,*(PassOptions **)((long)this + 0xe0),
               *(Module **)((long)this + 0xd0),iff->ifTrue);
    bVar1 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_448);
    if (bVar1) {
      pSVar2 = (Select *)0x0;
    }
    else {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 *(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),iff->ifFalse);
      bVar1 = EffectAnalyzer::hasSideEffects
                        ((EffectAnalyzer *)
                         &ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar1) {
        pSVar2 = (Select *)0x0;
      }
      else {
        EffectAnalyzer::EffectAnalyzer
                  ((EffectAnalyzer *)
                   &ifFalse.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   *(PassOptions **)((long)this + 0xe0),*(Module **)((long)this + 0xd0),
                   iff->condition);
        bVar1 = EffectAnalyzer::invalidates
                          ((EffectAnalyzer *)
                           &ifFalse.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                           ,(EffectAnalyzer *)local_448);
        if ((bVar1) ||
           (bVar1 = EffectAnalyzer::invalidates
                              ((EffectAnalyzer *)
                               &ifFalse.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,
                               (EffectAnalyzer *)
                               &ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count), bVar1)) {
          pSVar2 = (Select *)0x0;
        }
        else {
          condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               *(size_t *)((long)this + 0xd0);
          pSVar2 = Builder::makeSelect((Builder *)
                                       &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header
                                        ._M_node_count,iff->condition,iff->ifTrue,iff->ifFalse);
          if ((pSVar2->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id
              != (iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id)
          {
            *(undefined1 *)((long)this + 0xe9) = 1;
          }
        }
        EffectAnalyzer::~EffectAnalyzer
                  ((EffectAnalyzer *)
                   &ifFalse.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &ifTrue.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_448);
    return pSVar2;
  }
  return (Select *)0x0;
}

Assistant:

Select* selectify(If* iff) {
        // Only an if-else can be turned into a select.
        if (!iff->ifFalse) {
          return nullptr;
        }
        if (!Properties::canEmitSelectWithArms(iff->ifTrue, iff->ifFalse)) {
          return nullptr;
        }
        if (iff->condition->type == Type::unreachable) {
          // An if with an unreachable condition may nonetheless have a type
          // that is not unreachable,
          //
          // (if (result i32) (unreachable) ..)
          //
          // Turning such an if into a select would change the type of the
          // expression, which would require updating types further up. Avoid
          // that, leaving dead code elimination to that dedicated pass.
          return nullptr;
        }
        // This is always helpful for code size, but can be a tradeoff with
        // performance as we run both code paths. So when shrinking we always
        // try to do this, but otherwise must consider more carefully.
        if (tooCostlyToRunUnconditionally(
              passOptions, iff->ifTrue, iff->ifFalse)) {
          return nullptr;
        }
        // Check if side effects allow this: we need to execute the two arms
        // unconditionally, and also to make the condition run last.
        EffectAnalyzer ifTrue(passOptions, *getModule(), iff->ifTrue);
        if (ifTrue.hasSideEffects()) {
          return nullptr;
        }
        EffectAnalyzer ifFalse(passOptions, *getModule(), iff->ifFalse);
        if (ifFalse.hasSideEffects()) {
          return nullptr;
        }
        EffectAnalyzer condition(passOptions, *getModule(), iff->condition);
        if (condition.invalidates(ifTrue) || condition.invalidates(ifFalse)) {
          return nullptr;
        }
        auto* select = Builder(*getModule())
                         .makeSelect(iff->condition, iff->ifTrue, iff->ifFalse);
        if (select->type != iff->type) {
          // If the select is more refined than the if it replaces, we must
          // propagate that outwards.
          refinalize = true;
        }
        return select;
      }